

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int trie_get_children(trie_node *root_node,trie_node ***array,uint *len)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint *len_local;
  trie_node ***array_local;
  trie_node *root_node_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root_node->lchild == (trie_node *)0x0) {
LAB_00107d01:
    if (root_node->rchild != (trie_node *)0x0) {
      *len = *len + 1;
      iVar2 = append_node_to_array(array,len,root_node->rchild);
      if ((iVar2 != 0) || (iVar2 = trie_get_children(root_node->rchild,array,len), iVar2 == -1))
      goto LAB_00107d5a;
    }
    root_node_local._4_4_ = 0;
  }
  else {
    *len = *len + 1;
    iVar2 = append_node_to_array(array,len,root_node->lchild);
    if ((iVar2 == 0) && (iVar2 = trie_get_children(root_node->lchild,array,len), iVar2 != -1))
    goto LAB_00107d01;
LAB_00107d5a:
    lrtr_free(*array);
    root_node_local._4_4_ = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return root_node_local._4_4_;
}

Assistant:

int trie_get_children(const struct trie_node *root_node, struct trie_node ***array, unsigned int *len)
{
	if (root_node->lchild) {
		*len += 1;
		if (append_node_to_array(array, len, root_node->lchild))
			goto err;

		if (trie_get_children(root_node->lchild, array, len) == -1)
			goto err;
	}

	if (root_node->rchild) {
		*len += 1;
		if (append_node_to_array(array, len, root_node->rchild))
			goto err;

		if (trie_get_children(root_node->rchild, array, len) == -1)
			goto err;
	}

	return 0;

err:
	lrtr_free(*array);
	return -1;
}